

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

TriangleMesh * __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::getMesh
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *this,size_t objectID
          )

{
  TriangleMesh *pTVar1;
  TriangleMesh *pTVar2;
  
  pTVar1 = (TriangleMesh *)(this->scene->geometries).items[objectID].ptr;
  pTVar2 = (TriangleMesh *)0x0;
  if ((pTVar1 != (TriangleMesh *)0x0) && (*(char *)&(pTVar1->super_Geometry).field_8 == '\x14')) {
    pTVar2 = pTVar1;
  }
  return pTVar2;
}

Assistant:

Mesh* getMesh (size_t objectID) {
        return this->scene->template getSafe<Mesh>(objectID);
      }